

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O2

void do_commands(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  short *psVar5;
  char buf [4608];
  
  psVar5 = &cmd_table[0].show;
  iVar4 = 0;
  while (pcVar2 = ((cmd_type *)(psVar5 + -0xb))->name, *pcVar2 != '\0') {
    sVar1 = psVar5[-2];
    if (sVar1 < 0x33) {
      iVar3 = get_trust(ch);
      if ((sVar1 <= iVar3) && (*psVar5 != 0)) {
        sprintf(buf,"%-12s",pcVar2);
        send_to_char(buf,ch);
        iVar4 = iVar4 + 1;
        if (iVar4 % 6 == 0) {
          send_to_char("\n\r",ch);
        }
      }
    }
    psVar5 = psVar5 + 0x14;
  }
  if (iVar4 % 6 != 0) {
    send_to_char("\n\r",ch);
  }
  return;
}

Assistant:

void do_commands(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	int cmd;
	int col;

	col = 0;

	for (cmd = 0; cmd_table[cmd].name[0] != '\0'; cmd++)
	{
		if (cmd_table[cmd].level < LEVEL_HERO && cmd_table[cmd].level <= get_trust(ch) && cmd_table[cmd].show)
		{
			sprintf(buf, "%-12s", cmd_table[cmd].name);
			send_to_char(buf, ch);

			if (++col % 6 == 0)
				send_to_char("\n\r", ch);
		}
	}

	if (col % 6 != 0)
		send_to_char("\n\r", ch);
}